

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calicam.cpp
# Opt level: O3

void InitRectifyMap(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  char *__s;
  size_t sVar5;
  double *pdVar6;
  Mat *m;
  Mat *local_518;
  size_t local_510;
  double *local_508;
  uchar *local_500;
  double *local_4f8;
  double local_4f0;
  MatConstIterator local_4e8;
  double local_4c0;
  Size local_4b8;
  Size local_4b0;
  uint local_4a8;
  undefined4 uStack_4a4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_4a0;
  long *local_448;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_440;
  Mat local_3e8 [96];
  Mat local_388 [96];
  Mat local_328 [96];
  Mat local_2c8 [96];
  Mat local_268 [96];
  Mat local_208 [96];
  Mat local_1a8 [96];
  Mat local_148 [96];
  Mat local_e8 [96];
  Mat local_88 [96];
  
  local_4f0 = (double)height_now;
  local_4c0 = tan((((double)vfov_now * 3.141592653589793) / 180.0) * 0.5);
  cv::Mat::Mat((Mat *)&local_448,3,3,6);
  cv::MatConstIterator::MatConstIterator(&local_4e8,(Mat *)&local_448);
  local_4f0 = (local_4f0 * 0.5) / local_4c0;
  *(double *)local_4e8.ptr = local_4f0;
  if (local_4e8.m == (Mat *)0x0) {
    local_4e8.m = (Mat *)0x0;
    local_508 = (double *)local_4e8.ptr;
  }
  else {
    local_508 = (double *)((long)local_4e8.ptr + local_4e8.elemSize);
    if (local_4e8.sliceEnd <= (double *)((long)local_4e8.ptr + local_4e8.elemSize)) {
      cv::MatConstIterator::seek((long)&local_4e8,true);
      local_508 = (double *)local_4e8.ptr;
    }
  }
  local_510 = local_4e8.elemSize;
  local_500 = local_4e8.sliceStart;
  local_4f8 = (double *)local_4e8.sliceEnd;
  *local_508 = 0.0;
  local_518 = local_4e8.m;
  if (local_4e8.m == (Mat *)0x0) {
    *local_508 = (double)width_now * 0.5 + -0.5;
LAB_001054b4:
    *local_508 = 0.0;
LAB_001054bb:
    *local_508 = (double)height_now * 0.5 + -0.5;
LAB_001054da:
    *local_508 = 0.0;
LAB_001054e1:
    *local_508 = 0.0;
LAB_001054e8:
    *local_508 = 1.0;
LAB_001054f5:
    m = (Mat *)0x0;
    pdVar6 = local_508;
  }
  else {
    pdVar6 = (double *)(local_4e8.elemSize + (long)local_508);
    if (pdVar6 < local_4e8.sliceEnd) {
      *pdVar6 = (double)width_now * 0.5 + -0.5;
    }
    else {
      cv::MatConstIterator::seek((long)&local_518,true);
      *local_508 = (double)width_now * 0.5 + -0.5;
      pdVar6 = local_508;
      if (local_518 == (Mat *)0x0) goto LAB_001054b4;
    }
    local_508 = (double *)(local_510 + (long)pdVar6);
    if (local_508 < local_4f8) {
      *local_508 = 0.0;
    }
    else {
      local_508 = pdVar6;
      cv::MatConstIterator::seek((long)&local_518,true);
      *local_508 = 0.0;
      if (local_518 == (Mat *)0x0) goto LAB_001054bb;
    }
    pdVar6 = (double *)(local_510 + (long)local_508);
    if (pdVar6 < local_4f8) {
      *pdVar6 = local_4f0;
    }
    else {
      cv::MatConstIterator::seek((long)&local_518,true);
      *local_508 = local_4f0;
      pdVar6 = local_508;
      if (local_518 == (Mat *)0x0) goto LAB_001054bb;
    }
    local_508 = (double *)(local_510 + (long)pdVar6);
    if (local_508 < local_4f8) {
      *local_508 = (double)height_now * 0.5 + -0.5;
    }
    else {
      local_508 = pdVar6;
      cv::MatConstIterator::seek((long)&local_518,true);
      *local_508 = (double)height_now * 0.5 + -0.5;
      if (local_518 == (Mat *)0x0) goto LAB_001054da;
    }
    pdVar6 = (double *)(local_510 + (long)local_508);
    if (pdVar6 < local_4f8) {
      *pdVar6 = 0.0;
    }
    else {
      cv::MatConstIterator::seek((long)&local_518,true);
      *local_508 = 0.0;
      pdVar6 = local_508;
      if (local_518 == (Mat *)0x0) goto LAB_001054e1;
    }
    local_508 = (double *)(local_510 + (long)pdVar6);
    if (local_508 < local_4f8) {
      *local_508 = 0.0;
    }
    else {
      local_508 = pdVar6;
      cv::MatConstIterator::seek((long)&local_518,true);
      *local_508 = 0.0;
      if (local_518 == (Mat *)0x0) goto LAB_001054e8;
    }
    pdVar6 = (double *)(local_510 + (long)local_508);
    if (pdVar6 < local_4f8) {
      *pdVar6 = 1.0;
      local_508 = pdVar6;
    }
    else {
      cv::MatConstIterator::seek((long)&local_518,true);
      *local_508 = 1.0;
      if (local_518 == (Mat *)0x0) goto LAB_001054f5;
    }
    m = local_518;
    pdVar6 = (double *)(local_510 + (long)local_508);
    if (local_4f8 <= (double *)(local_510 + (long)local_508)) {
      cv::MatConstIterator::seek((long)&local_518,true);
      m = local_518;
      pdVar6 = local_508;
    }
  }
  local_508 = pdVar6;
  cv::Mat::Mat((Mat *)&local_4a8);
  local_4a8 = local_4a8 & 0xfffff000 | 6;
  cv::Mat_<double>::operator=((Mat_<double> *)&local_4a8,m);
  cv::Mat::operator=((Mat *)Knew,(Mat *)&local_4a8);
  cv::Mat::~Mat((Mat *)&local_4a8);
  cv::Mat::~Mat((Mat *)&local_448);
  iVar2 = height_now;
  iVar1 = width_now;
  cv::Mat::Mat(local_88,(Mat *)Kl);
  cv::Mat::Mat(local_e8,(Mat *)Dl);
  cv::Mat::Mat(local_148,(Mat *)xil);
  cv::Mat::Mat(local_1a8,(Mat *)Rl);
  cv::Mat::Mat(local_208,(Mat *)Knew);
  local_4b0.width = iVar1;
  local_4b0.height = iVar2;
  InitUndistortRectifyMap
            (local_88,local_e8,local_148,local_1a8,local_208,&local_4b0,(Mat *)smap,
             (Mat *)(smap + 0x60));
  cv::Mat::~Mat(local_208);
  cv::Mat::~Mat(local_1a8);
  cv::Mat::~Mat(local_148);
  cv::Mat::~Mat(local_e8);
  cv::Mat::~Mat(local_88);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Width: ",7);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,width_now);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Height: ",8);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,height_now);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"V.Fov: ",7);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,vfov_now);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"K Matrix: \n",0xb);
  cv::Formatter::get(&local_448,0);
  (**(code **)(*local_448 + 0x10))(&local_4a8,local_448,Knew);
  (**(code **)(*(long *)CONCAT44(uStack_4a4,local_4a8) + 8))();
  __s = (char *)(*(code *)**(undefined8 **)CONCAT44(uStack_4a4,local_4a8))();
  while (__s != (char *)0x0) {
    sVar5 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar5);
    __s = (char *)(*(code *)**(undefined8 **)CONCAT44(uStack_4a4,local_4a8))();
  }
  if (local_4a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4a0);
  }
  if (local_440 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_440);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  iVar3 = std::__cxx11::string::compare((char *)&cam_model_abi_cxx11_);
  if (iVar3 == 0) {
    cv::Mat::Mat(local_268,(Mat *)Kr);
    cv::Mat::Mat(local_2c8,(Mat *)Dr);
    cv::Mat::Mat(local_328,(Mat *)xir);
    cv::Mat::Mat(local_388,(Mat *)Rr);
    cv::Mat::Mat(local_3e8,(Mat *)Knew);
    local_4b8.width = iVar1;
    local_4b8.height = iVar2;
    InitUndistortRectifyMap
              (local_268,local_2c8,local_328,local_388,local_3e8,&local_4b8,(Mat *)(smap + 0xc0),
               (Mat *)(smap + 0x120));
    cv::Mat::~Mat(local_3e8);
    cv::Mat::~Mat(local_388);
    cv::Mat::~Mat(local_328);
    cv::Mat::~Mat(local_2c8);
    cv::Mat::~Mat(local_268);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Ndisp: ",7);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,ndisp_now);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Wsize: ",7);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,wsize_now);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  return;
}

Assistant:

void InitRectifyMap() {
  double vfov_rad = vfov_now * CV_PI / 180.;
  double focal = height_now / 2. / tan(vfov_rad / 2.);
  Knew = (cv::Mat_<double>(3, 3) << focal, 0., width_now  / 2. - 0.5,
                                    0., focal, height_now / 2. - 0.5,
                                    0., 0., 1.);

  cv::Size img_size(width_now, height_now);

  InitUndistortRectifyMap(Kl, Dl, xil, Rl, Knew,
                          img_size, smap[0][0], smap[0][1]);

  std::cout << "Width: "  << width_now  << "\t"
            << "Height: " << height_now << "\t"
            << "V.Fov: "  << vfov_now   << "\n";
  std::cout << "K Matrix: \n" << Knew << std::endl;

  if (cam_model == "stereo") {
    InitUndistortRectifyMap(Kr, Dr, xir, Rr, Knew,
                            img_size, smap[1][0], smap[1][1]);
    std::cout << "Ndisp: " << ndisp_now << "\t"
              << "Wsize: " << wsize_now << "\n";
  }
  std::cout << std::endl;
}